

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dataset.cpp
# Opt level: O2

void __thiscall DataSet::load(DataSet *this,string *filepath,uint ignored_lines,bool auto_read)

{
  Matrix *this_00;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *this_01;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pmVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  istream *piVar5;
  ulong uVar6;
  double *pdVar7;
  iterator iVar8;
  uint uVar9;
  ulong uVar10;
  uint unaff_R14D;
  double dVar11;
  allocator_type local_5e9;
  DataSet *local_5e8;
  uint local_5e0;
  uint local_5dc;
  vector<double,_std::allocator<double>_> inputs;
  uint dims [2];
  string line;
  vector<double,_std::allocator<double>_> out;
  double local_550;
  ifstream file;
  byte abStack_528 [488];
  stringstream stream;
  ostream local_330 [376];
  stringstream stream_1;
  ostream local_1a8 [376];
  
  local_5e8 = this;
  local_5e0 = ignored_lines;
  std::__cxx11::string::_M_assign((string *)&this->m_filePath);
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::ifstream::ifstream(&file,(string *)filepath,_S_in);
  if ((abStack_528[*(long *)(_file + -0x18)] & 5) != 0) {
    std::operator<<((ostream *)&std::cout,"ERROR [load file]: Couldn\'t load the dataset file!\n");
    exit(1);
  }
  inputs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  inputs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  inputs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (local_5e0 == 0 && !auto_read) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&file,(string *)&line)
    ;
    std::operator<<(local_330,(string *)&line);
    uVar10 = 0;
    while (piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                              ((istream *)&stream,(string *)&line,','),
          ((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
      uVar3 = std::__cxx11::stoi(&line,(size_t *)0x0,10);
      dims[uVar10] = uVar3;
      uVar10 = (ulong)((int)uVar10 + 1);
    }
    Matrix::set_shape(&local_5e8->m_inputSet,dims[0],dims[1] - 1);
    Matrix::set_shape(&local_5e8->m_outputSet,dims[0],1);
    std::ios::clear((int)(istream *)&stream + (int)*(undefined8 *)(_stream + -0x18));
    unaff_R14D = dims[1];
  }
  this_00 = &local_5e8->m_outputSet;
  this_01 = &local_5e8->m_map;
  pmVar1 = &local_5e8->m_map;
  iVar4 = 0;
  uVar9 = 0;
  local_5dc = 0;
  uVar10 = 0;
  while (piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                            ((istream *)&file,(string *)&line),
        ((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
    std::__cxx11::stringstream::stringstream((stringstream *)&stream_1);
    std::operator<<(local_1a8,(string *)&line);
    local_5dc = local_5dc + 1;
    if (local_5e0 < local_5dc) {
      while (piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                ((istream *)&stream_1,(string *)&line,','),
            ((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) == 0) {
        if (auto_read) {
          bVar2 = is_word(&line);
          if (bVar2) {
            iVar8 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                    ::find(&this_01->_M_t,&line);
            if ((_Rb_tree_header *)iVar8._M_node == &(pmVar1->_M_t)._M_impl.super__Rb_tree_header) {
              std::__cxx11::string::string((string *)&out,(string *)&line);
              iVar4 = iVar4 + 1;
              std::
              _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
              ::_M_insert_unique<std::pair<std::__cxx11::string_const,unsigned_int>>
                        ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                          *)this_01,
                         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                          *)&out);
              std::__cxx11::string::~string((string *)&out);
            }
            local_550 = (double)(iVar4 - 1);
          }
          else {
            local_550 = strtod(line._M_dataplus._M_p,(char **)0x0);
          }
          std::vector<double,_std::allocator<double>_>::push_back(&inputs,&local_550);
        }
        else {
          dVar11 = strtod(line._M_dataplus._M_p,(char **)0x0);
          if (uVar9 < unaff_R14D - 1) {
            uVar6 = (ulong)uVar9;
            uVar9 = uVar9 + 1;
            pdVar7 = (double *)
                     (uVar6 * 8 +
                     *(long *)&(local_5e8->m_inputSet).m_vals.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar10].
                               super__Vector_base<double,_std::allocator<double>_>);
            uVar6 = uVar10;
          }
          else {
            uVar6 = (ulong)((int)uVar10 + 1);
            pdVar7 = *(double **)
                      &(this_00->m_vals).
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar10].
                       super__Vector_base<double,_std::allocator<double>_>._M_impl;
            uVar9 = 0;
          }
          *pdVar7 = dVar11;
          uVar10 = uVar6;
        }
      }
      if (auto_read) {
        std::vector<double,_std::allocator<double>_>::vector(&out,1,&local_5e9);
        *out.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
         _M_start = inputs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1];
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::push_back(&this_00->m_vals,&out);
        inputs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_finish = inputs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish + -1;
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     *)local_5e8,&inputs);
        if (inputs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            inputs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start) {
          inputs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
          ._M_finish = inputs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
        }
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  (&out.super__Vector_base<double,_std::allocator<double>_>);
      }
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream_1);
  }
  update(local_5e8);
  std::ifstream::close();
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&inputs.super__Vector_base<double,_std::allocator<double>_>);
  std::ifstream::~ifstream(&file);
  std::__cxx11::string::~string((string *)&line);
  std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
  return;
}

Assistant:

void DataSet::load(const std::string& filepath, uint ignored_lines, bool auto_read){
    m_filePath=filepath;

    std::stringstream stream;
    std::string line;
    std::ifstream file(filepath);

    if(!file){
        std::cout<<"ERROR [load file]: Couldn't load the dataset file!\n";
        exit(1);
    }

    uint dims[2], i=0, j=0, n_lines=0, word_count=0;
    std::vector<double> inputs;
    double val;

    if(!ignored_lines && !auto_read){
        std::getline(file, line);
        stream<<line;
        // std::cout<<" dbg first line: "<<line<<'\n';
        while(std::getline(stream, line, ',')){
            // std::cout<<" dbg token: "<<line<<'\n';
            dims[i++]=std::stoi(line);
            // std::cout<<" dims #"<<i-1<<": "<<dims[i-1]<<'\n';
        }
        // std::cout<<" dbg parsed\n";
        m_inputSet.set_shape(dims[0], dims[1]-1);
        m_outputSet.set_shape(dims[0], 1);
        i=0;
        stream.clear();
    }

    // std::cout<<" dbg dims: "<<dims[0]<<", "<<dims[1]<<'\n';
    // std::cout<<" dbg input shape: "<<m_inputSet.shape()<<"; output shape: "<<m_outputSet.shape()<<'\n';

    while(std::getline(file, line)){
        std::stringstream stream;
        stream<<line;
        // std::cout<<" dbg auto-reading line: "<<stream.str()<<"\n";
        if(ignored_lines>=++n_lines) continue;
        while(std::getline(stream, line, ',')){
            if(auto_read){
                // std::cout<<" > "<<line;
                if(is_word(line)){
                    // std::cout<<" +\n";
                    if(m_map.find(line)==m_map.end()){
                        // std::cout<<"Not Found!\n";
                        m_map.insert({line, ++word_count});
                    }
                    val=word_count-1;
                }
                else{
                    // std::cout<<" -\n";
                    val=strtod(line.c_str(), nullptr);
                }
                inputs.push_back(val);
            }
            else{
                if(j<dims[1]-1){
                    // std::cout<<" dbg writing inputSet\n";
                    m_inputSet.m_vals[i][j++]=strtod(line.c_str(), nullptr);
                }
                else{
                    // std::cout<<" dbg writing outputSet\n";
                    m_outputSet.m_vals[i++][0]=strtod(line.c_str(), nullptr);
                    j=0;
                }
            }
        }
        // std::cout<<"\nClearing stream\n";
        if(auto_read && ignored_lines<n_lines){
            // std::cout<<" > pushing the data back\n";
            std::vector<double> out(1);
            out[0]=inputs[inputs.size()-1];
            m_outputSet.m_vals.push_back(out);
            inputs.erase(inputs.end()-1);
            m_inputSet.m_vals.push_back(inputs);
            inputs.clear();
        }
        // stream.clear();
    }

    update();
    file.close();
}